

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool ON_ModelComponent::IsValidComponentName
               (ON_ComponentManifest *model_manfest,ON_ModelComponent *model_component,
               bool bPermitReferencePrefix,ON_wString *valid_name)

{
  ON_UUID parent_id;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  ON__UINT64 OVar5;
  ON__UINT64 OVar6;
  wchar_t *pwVar7;
  ON_UUID *pOVar8;
  ON_UUID component_parent_id;
  ON_UUID component_parent_id_00;
  uint in_stack_fffffffffffffe5c;
  ON_ComponentManifestItem *local_140;
  bool local_f9;
  ON_ComponentManifestItem *local_f0;
  ON_ComponentManifest local_c0;
  uchar local_b8 [8];
  wchar_t *pwStack_b0;
  ON_ComponentManifest local_a0;
  undefined8 local_98;
  uchar auStack_90 [8];
  ON_ComponentManifestItem *local_88;
  ON_ComponentManifestItem *leaf_item;
  ON_wString local_78;
  ON_wString leaf;
  ON_wString parent;
  ON_wString ref;
  bool bItemFromNameIsOK;
  ON_ComponentManifestItem *item;
  bool bUniqueNameRequired;
  undefined1 local_38 [7];
  bool rc;
  ON_wString original_name;
  Type model_component_type;
  ON_wString *valid_name_local;
  bool bPermitReferencePrefix_local;
  ON_ModelComponent *model_component_local;
  ON_ComponentManifest *model_manfest_local;
  
  ON_wString::operator=(valid_name,&ON_wString::EmptyString);
  original_name.m_s._7_1_ = ComponentType(model_component);
  Name((ON_ModelComponent *)local_38);
  bVar1 = false;
  bVar2 = IsValidComponentName((ON_wString *)local_38);
  if (bVar2) {
    bVar2 = UniqueNameRequired(original_name.m_s._7_1_);
    if ((!bPermitReferencePrefix) || (bVar2)) {
      if (bVar2) {
        local_f0 = ON_ComponentManifest::ItemFromName(model_manfest,model_component);
      }
      else {
        local_f0 = &ON_ComponentManifestItem::UnsetItem;
      }
      OVar5 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(local_f0);
      OVar6 = RuntimeSerialNumber(model_component);
      local_f9 = true;
      if (OVar5 != OVar6) {
        bVar3 = ON_ComponentManifestItem::IsUnset(local_f0);
        local_f9 = true;
        if (!bVar3) {
          local_f9 = ON_ComponentManifestItem::IsSystemComponent(local_f0);
        }
      }
      if ((local_f9 == false) || (!bPermitReferencePrefix)) {
        ON_wString::ON_wString(&parent);
        ON_wString::ON_wString(&leaf);
        ON_wString::ON_wString(&local_78);
        pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_38);
        SplitName(pwVar7,&parent,&leaf,&local_78);
        if ((local_f9 == false) || (bVar3 = ON_wString::IsEmpty(&parent), !bVar3)) {
          bVar3 = IsValidComponentName(&local_78);
          TVar4 = original_name.m_s._7_1_;
          if (bVar3) {
            if (bVar2) {
              pOVar8 = ParentId(model_component);
              local_98._0_4_ = pOVar8->Data1;
              local_98._4_2_ = pOVar8->Data2;
              local_98._6_2_ = pOVar8->Data3;
              auStack_90 = *&pOVar8->Data4;
              pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_78);
              parent_id.Data4[0] = auStack_90[0];
              parent_id.Data4[1] = auStack_90[1];
              parent_id.Data4[2] = auStack_90[2];
              parent_id.Data4[3] = auStack_90[3];
              parent_id.Data4[4] = auStack_90[4];
              parent_id.Data4[5] = auStack_90[5];
              parent_id.Data4[6] = auStack_90[6];
              parent_id.Data4[7] = auStack_90[7];
              parent_id.Data1 = (undefined4)local_98;
              parent_id.Data2 = local_98._4_2_;
              parent_id.Data3 = local_98._6_2_;
              local_140 = ON_ComponentManifest::ItemFromName(model_manfest,TVar4,parent_id,pwVar7);
            }
            else {
              local_140 = &ON_ComponentManifestItem::UnsetItem;
            }
            local_88 = local_140;
            bVar2 = ON_ComponentManifestItem::IsUnset(local_140);
            if ((bVar2) || (bVar2 = ON_ComponentManifestItem::IsSystemComponent(local_88), bVar2)) {
              ON_wString::operator=(valid_name,&local_78);
            }
            else {
              TVar4 = ComponentType(model_component);
              pOVar8 = ParentId(model_component);
              local_b8 = *(uchar (*) [8])pOVar8;
              pwStack_b0 = *(wchar_t **)pOVar8->Data4;
              pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_78);
              component_parent_id._1_7_ = 0;
              component_parent_id.Data1._0_1_ = TVar4;
              component_parent_id.Data4[0] = local_b8[0];
              component_parent_id.Data4[1] = local_b8[1];
              component_parent_id.Data4[2] = local_b8[2];
              component_parent_id.Data4[3] = local_b8[3];
              component_parent_id.Data4[4] = local_b8[4];
              component_parent_id.Data4[5] = local_b8[5];
              component_parent_id.Data4[6] = local_b8[6];
              component_parent_id.Data4[7] = local_b8[7];
              ON_ComponentManifest::UnusedName
                        (&local_a0,(Type)model_manfest,component_parent_id,pwStack_b0,pwVar7,
                         (wchar_t *)0x0,0,(uint *)((ulong)in_stack_fffffffffffffe5c << 0x20));
              ON_wString::operator=(valid_name,(ON_wString *)&local_a0);
              ON_wString::~ON_wString((ON_wString *)&local_a0);
            }
          }
        }
        else {
          bVar1 = true;
        }
        leaf_item._4_4_ = 2;
        ON_wString::~ON_wString(&local_78);
        ON_wString::~ON_wString(&leaf);
        ON_wString::~ON_wString(&parent);
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
  }
  if (bVar1 == false) {
    bVar2 = ON_wString::IsEmpty(valid_name);
    TVar4 = original_name.m_s._7_1_;
    if (bVar2) {
      pOVar8 = ParentId(model_component);
      component_parent_id_00._1_7_ = 0;
      component_parent_id_00.Data1._0_1_ = TVar4;
      component_parent_id_00.Data4 = *(uchar (*) [8])pOVar8;
      ON_ComponentManifest::UnusedName
                (&local_c0,(Type)model_manfest,component_parent_id_00,*(wchar_t **)pOVar8->Data4,
                 (wchar_t *)0x0,(wchar_t *)0x0,0,(uint *)((ulong)in_stack_fffffffffffffe5c << 0x20))
      ;
      ON_wString::operator=(valid_name,(ON_wString *)&local_c0);
      ON_wString::~ON_wString((ON_wString *)&local_c0);
    }
  }
  else {
    ON_wString::operator=(valid_name,(ON_wString *)local_38);
  }
  leaf_item._4_4_ = 1;
  ON_wString::~ON_wString((ON_wString *)local_38);
  return bVar1;
}

Assistant:

bool ON_ModelComponent::IsValidComponentName(
  const class ON_ComponentManifest&  model_manfest,
  const ON_ModelComponent& model_component,
  bool bPermitReferencePrefix,
  ON_wString& valid_name
)
{
  valid_name = ON_wString::EmptyString;
  const ON_ModelComponent::Type model_component_type = model_component.ComponentType();

  const ON_wString original_name = model_component.Name();

  bool rc = false;
  for (;;)
  {
    if (false == ON_ModelComponent::IsValidComponentName(original_name))
    {
      break;
    }

    const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(model_component_type);
    if (bPermitReferencePrefix && false == bUniqueNameRequired)
    {
      rc = true;
      break;
    }

    const class ON_ComponentManifestItem& item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(&model_component)
      : ON_ComponentManifestItem::UnsetItem;

    const bool bItemFromNameIsOK
      =  (item.ComponentRuntimeSerialNumber() == model_component.RuntimeSerialNumber())
      || item.IsUnset()
      || item.IsSystemComponent()
      ;

    if ( bItemFromNameIsOK && bPermitReferencePrefix)
    {
      rc = true;
      break;
    }

    ON_wString ref;
    ON_wString parent;
    ON_wString leaf;
    ON_ModelComponent::SplitName(
      original_name,
      ref,
      parent,
      leaf
    );
    if (bItemFromNameIsOK && ref.IsEmpty())
    {
      rc = true;
      break;
    }

    if (false == ON_ModelComponent::IsValidComponentName(leaf))
      break;

    const class ON_ComponentManifestItem& leaf_item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(model_component_type,model_component.ParentId(),leaf)
      : ON_ComponentManifestItem::UnsetItem;

    if (leaf_item.IsUnset() || leaf_item.IsSystemComponent())
    {
      valid_name = leaf;
      break;
    }

    valid_name = model_manfest.UnusedName(
      model_component.ComponentType(),
      model_component.ParentId(),
      leaf,
      nullptr,
      nullptr,
      0,
      nullptr
    );

    break;
  }

  if (rc)
  {
    valid_name = original_name;
  }
  else if (valid_name.IsEmpty())
  {
    valid_name = model_manfest.UnusedName(
      model_component_type,
      model_component.ParentId(),
      nullptr,
      nullptr,
      nullptr,
      0,
      nullptr
    );
  }

  return rc;
}